

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int mbedtls_base64_decode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  
  lVar3 = 0;
  uVar12 = 0;
  uVar10 = 0;
  while (lVar13 = slen - uVar10, uVar11 = uVar10, uVar10 <= slen && lVar13 != 0) {
    uVar9 = ~uVar10;
    lVar6 = 0;
    while( true ) {
      uVar11 = slen;
      if (lVar13 == lVar6) goto LAB_0012ef7a;
      if (src[lVar6 + uVar10] != ' ') break;
      uVar9 = uVar9 - 1;
      lVar6 = lVar6 + 1;
    }
    if (lVar13 == lVar6) break;
    bVar4 = src[lVar6 + uVar10];
    if (bVar4 == 0xd && 1 < (ulong)(lVar13 - lVar6)) {
      if (src[lVar6 + 1 + uVar10] != '\n') {
        bVar4 = 0xd;
        if ((int)lVar6 != 0) {
          return -0x2c;
        }
LAB_0012ef42:
        if ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
            [bVar4] == 0x7f) {
          return -0x2c;
        }
        if ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
            [bVar4] < 0x40 && uVar12 != 0) {
          return -0x2c;
        }
        lVar3 = lVar3 + 1;
      }
    }
    else if (bVar4 != 10) {
      if ((int)lVar6 != 0) {
        return -0x2c;
      }
      if (bVar4 == 0x3d) {
        if (1 < uVar12) {
          return -0x2c;
        }
        uVar12 = uVar12 + 1;
        bVar4 = 0x3d;
      }
      else if ((char)bVar4 < '\0') {
        return -0x2c;
      }
      goto LAB_0012ef42;
    }
    uVar10 = -uVar9;
  }
LAB_0012ef7a:
  if (lVar3 == 0) {
    sVar7 = 0;
  }
  else {
    sVar7 = (lVar3 * 6 + 7U >> 3) - (ulong)uVar12;
    iVar1 = -0x2a;
    if ((dst == (uchar *)0x0) || (dlen < sVar7)) goto LAB_0012f066;
    uVar5 = 3;
    lVar3 = 0;
    uVar12 = 0;
    puVar8 = dst;
    for (sVar7 = 0; uVar11 != sVar7; sVar7 = sVar7 + 1) {
      uVar10 = (ulong)src[sVar7];
      if ((0x20 < uVar10) || ((0x100002400U >> (uVar10 & 0x3f) & 1) == 0)) {
        uVar5 = uVar5 - (uVar10 == 0x3d);
        uVar2 = uVar12 << 6;
        uVar12 = "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
                 [uVar10] & 0x3f | uVar2;
        lVar3 = lVar3 + 1;
        if (lVar3 == 4) {
          if (uVar5 == 0) {
            lVar3 = 0;
            uVar5 = 0;
          }
          else {
            *puVar8 = (uchar)(uVar2 >> 0x10);
            if (uVar5 == 1) {
              puVar8 = puVar8 + 1;
              lVar3 = 0;
              uVar5 = 1;
            }
            else {
              puVar8[1] = (uchar)(uVar2 >> 8);
              if (uVar5 < 3) {
                puVar8 = puVar8 + 2;
                lVar3 = 0;
                uVar5 = 2;
              }
              else {
                puVar8[2] = (uchar)uVar12;
                puVar8 = puVar8 + 3;
                lVar3 = 0;
              }
            }
          }
        }
      }
    }
    sVar7 = (long)puVar8 - (long)dst;
  }
  iVar1 = 0;
LAB_0012f066:
  *olen = sVar7;
  return iVar1;
}

Assistant:

int mbedtls_base64_decode( unsigned char *dst, size_t dlen, size_t *olen,
                   const unsigned char *src, size_t slen )
{
    size_t i, n;
    uint32_t j, x;
    unsigned char *p;

    /* First pass: check for validity and get output length */
    for( i = n = j = 0; i < slen; i++ )
    {
        /* Skip spaces before checking for EOL */
        x = 0;
        while( i < slen && src[i] == ' ' )
        {
            ++i;
            ++x;
        }

        /* Spaces at end of buffer are OK */
        if( i == slen )
            break;

        if( ( slen - i ) >= 2 &&
            src[i] == '\r' && src[i + 1] == '\n' )
            continue;

        if( src[i] == '\n' )
            continue;

        /* Space inside a line is an error */
        if( x != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] == '=' && ++j > 2 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] > 127 || base64_dec_map[src[i]] == 127 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( base64_dec_map[src[i]] < 64 && j != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        n++;
    }

    if( n == 0 )
    {
        *olen = 0;
        return( 0 );
    }

    n = ( ( n * 6 ) + 7 ) >> 3;
    n -= j;

    if( dst == NULL || dlen < n )
    {
        *olen = n;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

   for( j = 3, n = x = 0, p = dst; i > 0; i--, src++ )
   {
        if( *src == '\r' || *src == '\n' || *src == ' ' )
            continue;

        j -= ( base64_dec_map[*src] == 64 );
        x  = ( x << 6 ) | ( base64_dec_map[*src] & 0x3F );

        if( ++n == 4 )
        {
            n = 0;
            if( j > 0 ) *p++ = (unsigned char)( x >> 16 );
            if( j > 1 ) *p++ = (unsigned char)( x >>  8 );
            if( j > 2 ) *p++ = (unsigned char)( x       );
        }
    }

    *olen = p - dst;

    return( 0 );
}